

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QGraphicsProxyWidget * QWidgetPrivate::nearestGraphicsProxyWidget(QWidget *origin)

{
  bool bVar1;
  QWidgetPrivate *pQVar2;
  pointer pQVar3;
  long in_RDI;
  unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *extra;
  QWidget *origin_00;
  QGraphicsProxyWidget *local_8;
  
  if (in_RDI == 0) {
    local_8 = (QGraphicsProxyWidget *)0x0;
  }
  else {
    pQVar2 = QWidget::d_func((QWidget *)0x35e7ed);
    origin_00 = (QWidget *)&pQVar2->extra;
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35e7fe);
    if ((bVar1) &&
       (pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                           ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35e80d),
       pQVar3->proxyWidget != (QGraphicsProxyWidget *)0x0)) {
      pQVar3 = std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
                         ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35e81d);
      local_8 = pQVar3->proxyWidget;
    }
    else {
      QWidget::parentWidget((QWidget *)0x35e832);
      local_8 = nearestGraphicsProxyWidget(origin_00);
    }
  }
  return local_8;
}

Assistant:

QGraphicsProxyWidget *QWidgetPrivate::nearestGraphicsProxyWidget(const QWidget *origin)
{
    if (origin) {
        const auto &extra = origin->d_func()->extra;
        if (extra && extra->proxyWidget)
            return extra->proxyWidget;
        return nearestGraphicsProxyWidget(origin->parentWidget());
    }
    return nullptr;
}